

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

uint read_4(file *file,png_uint_32 *pu)

{
  int iVar1;
  png_uint_32 local_28;
  int ch;
  png_uint_32 val;
  uint i;
  png_uint_32 *pu_local;
  file *file_local;
  
  ch = 0;
  local_28 = 0;
  do {
    iVar1 = read_byte(file);
    if (iVar1 == -1) {
      return ch;
    }
    local_28 = local_28 * 0x100 + iVar1;
    ch = ch + 1;
  } while ((uint)ch < 4);
  *pu = local_28;
  return ch;
}

Assistant:

static unsigned int
read_4(struct file *file, png_uint_32 *pu)
   /* Read four bytes, returns the number of bytes read successfully and, if all
    * four bytes are read, assigns the result to *pu.
    */
{
   unsigned int i = 0;
   png_uint_32 val = 0;

   do
   {
      int ch = read_byte(file);

      if (ch == EOF)
         return i;

      val = (val << 8) + ch;
   } while (++i < 4);

   *pu = val;
   return i;
}